

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateTransformFeedbackShaderCaseBlocks
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool *blockContentGenerator)

{
  TestCaseGroup *pTVar1;
  Program *pPVar2;
  ShaderSet *this;
  Shader *this_00;
  undefined1 local_98 [8];
  SharedPtr shader;
  SharedPtr program_1;
  TestCaseGroup *blockGroup_1;
  undefined1 local_68 [4];
  int ndx;
  SharedPtr shaderSet;
  SharedPtr program;
  TestCaseGroup *blockGroup;
  int pipelineNdx;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool *blockContentGenerator_local;
  GLSLVersion glslVersion_local;
  TestCaseGroup *targetGroup_local;
  Context *context_local;
  
  for (blockGroup._4_4_ = 0; blockGroup._4_4_ < 4; blockGroup._4_4_ = blockGroup._4_4_ + 1) {
    pTVar1 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar1,context,
               generateTransformFeedbackShaderCaseBlocks::pipelines[blockGroup._4_4_].name,"");
    pPVar2 = (Program *)operator_new(0x28);
    ResourceDefinition::Program::Program(pPVar2,false);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&shaderSet.m_state,(Node *)pPVar2);
    this = (ShaderSet *)operator_new(0x30);
    ResourceDefinition::ShaderSet::ShaderSet
              (this,(SharedPtr *)&shaderSet.m_state,glslVersion,
               generateTransformFeedbackShaderCaseBlocks::pipelines[blockGroup._4_4_].stageBits,
               generateTransformFeedbackShaderCaseBlocks::pipelines[blockGroup._4_4_].lastStageBit);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_68,(Node *)this);
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
    (*blockContentGenerator)
              (context,(SharedPtr *)local_68,(TestCaseGroup *)pTVar1,
               (bool)(generateTransformFeedbackShaderCaseBlocks::pipelines[blockGroup._4_4_].
                      reducedSet & 1));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_68);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&shaderSet.m_state);
  }
  for (blockGroup_1._4_4_ = 0; blockGroup_1._4_4_ < 3; blockGroup_1._4_4_ = blockGroup_1._4_4_ + 1)
  {
    pTVar1 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar1,context,
               generateTransformFeedbackShaderCaseBlocks::singleStageCases[blockGroup_1._4_4_].name,
               "");
    pPVar2 = (Program *)operator_new(0x28);
    ResourceDefinition::Program::Program(pPVar2,true);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&shader.m_state,(Node *)pPVar2);
    this_00 = (Shader *)operator_new(0x28);
    ResourceDefinition::Shader::Shader
              (this_00,(SharedPtr *)&shader.m_state,
               generateTransformFeedbackShaderCaseBlocks::singleStageCases[blockGroup_1._4_4_].stage
               ,glslVersion);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_98,(Node *)this_00);
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
    (*blockContentGenerator)
              (context,(SharedPtr *)local_98,(TestCaseGroup *)pTVar1,
               (bool)(generateTransformFeedbackShaderCaseBlocks::singleStageCases
                      [blockGroup_1._4_4_].reducedSet & 1));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_98);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&shader.m_state);
  }
  return;
}

Assistant:

static void generateTransformFeedbackShaderCaseBlocks (Context& context, tcu::TestCaseGroup* targetGroup, glu::GLSLVersion glslVersion, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup*, bool))
{
	static const struct
	{
		const char*	name;
		deUint32	stageBits;
		deUint32	lastStageBit;
		bool		reducedSet;
	} pipelines[] =
	{
		{
			"vertex_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT),
			(1 << glu::SHADERTYPE_VERTEX),
			false
		},
		{
			"vertex_tess_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),
			(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),
			true
		},
		{
			"vertex_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_GEOMETRY),
			(1 << glu::SHADERTYPE_GEOMETRY),
			true
		},
		{
			"vertex_tess_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION) | (1 << glu::SHADERTYPE_GEOMETRY),
			(1 << glu::SHADERTYPE_GEOMETRY),
			true
		},
	};
	static const struct
	{
		const char*		name;
		glu::ShaderType	stage;
		bool			reducedSet;
	} singleStageCases[] =
	{
		{ "separable_vertex",		glu::SHADERTYPE_VERTEX,						false	},
		{ "separable_tess_eval",	glu::SHADERTYPE_TESSELLATION_EVALUATION,	true	},
		{ "separable_geometry",		glu::SHADERTYPE_GEOMETRY,					true	},
	};

	// monolithic pipeline
	for (int pipelineNdx = 0; pipelineNdx < DE_LENGTH_OF_ARRAY(pipelines); ++pipelineNdx)
	{
		TestCaseGroup* const						blockGroup		= new TestCaseGroup(context, pipelines[pipelineNdx].name, "");
		const ResourceDefinition::Node::SharedPtr	program			(new ResourceDefinition::Program());
		const ResourceDefinition::Node::SharedPtr	shaderSet		(new ResourceDefinition::ShaderSet(program,
																									   glslVersion,
																									   pipelines[pipelineNdx].stageBits,
																									   pipelines[pipelineNdx].lastStageBit));

		targetGroup->addChild(blockGroup);
		blockContentGenerator(context, shaderSet, blockGroup, pipelines[pipelineNdx].reducedSet);
	}

	// separable pipeline
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(singleStageCases); ++ndx)
	{
		TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, singleStageCases[ndx].name, "");
		const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program(true));
		const ResourceDefinition::Node::SharedPtr	shader				(new ResourceDefinition::Shader(program, singleStageCases[ndx].stage, glslVersion));

		targetGroup->addChild(blockGroup);
		blockContentGenerator(context, shader, blockGroup, singleStageCases[ndx].reducedSet);
	}
}